

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_storage_batch.c
# Opt level: O3

int log_policy_storage_batch_destroy(log_policy policy)

{
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)log_policy_instance(policy);
  if (__ptr != (undefined8 *)0x0) {
    if ((void *)*__ptr != (void *)0x0) {
      free((void *)*__ptr);
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

static int log_policy_storage_batch_destroy(log_policy policy)
{
	log_policy_storage_batch_data batch_data = log_policy_instance(policy);

	if (batch_data != NULL)
	{
		if (batch_data->buffer != NULL)
		{
			free(batch_data->buffer);
		}

		free(batch_data);
	}

	return 0;
}